

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_write.c
# Opt level: O2

int main(int argc,char **args)

{
  char *file_name;
  size_t __n;
  int iVar1;
  light_pcapng pcapng;
  FILE *__stream;
  uint32_t *__s1;
  FILE *__stream_00;
  void *__ptr;
  size_t __n_00;
  long lVar2;
  size_t size;
  light_pcapng local_e8;
  FILE *local_e0;
  long local_d8;
  char **local_d0;
  long local_c8;
  stat f_info;
  
  local_c8 = (long)argc;
  local_d0 = args;
  for (lVar2 = 1; lVar2 < local_c8; lVar2 = lVar2 + 1) {
    file_name = local_d0[lVar2];
    pcapng = light_read_from_path(file_name);
    if (pcapng == (light_pcapng)0x0) {
      fprintf(_stderr,"Unable to read pcapng: %s\n",file_name);
    }
    else {
      __stream = fopen("/tmp/pcapng.tmp","wb");
      __s1 = light_pcapng_to_memory(pcapng,&size);
      __stream_00 = fopen(file_name,"rb");
      stat(file_name,(stat *)&f_info);
      if (size == f_info.st_size) {
        local_e8 = pcapng;
        local_e0 = __stream;
        local_d8 = lVar2;
        printf("Data for %s: %zu bytes\n",file_name);
        __n = size;
        __ptr = calloc(size,1);
        __n_00 = fread(__ptr,1,__n,__stream_00);
        if (__n_00 == size) {
          iVar1 = bcmp(__s1,__ptr,__n_00);
          if (iVar1 == 0) {
            printf("SUCCESS for %s\n\n",file_name);
          }
          else {
            fprintf(_stderr,"FAILURE for %s\n\n",file_name);
          }
          __stream = local_e0;
          pcapng = local_e8;
          fwrite(__s1,size,1,local_e0);
          free(__ptr);
          lVar2 = local_d8;
        }
        else {
          fprintf(_stderr,"Error reading %s!\n",file_name);
          free(__ptr);
          __stream = local_e0;
          pcapng = local_e8;
          lVar2 = local_d8;
        }
      }
      else {
        fprintf(_stderr,"Memory size mismatch %zu != %zu\n");
      }
      fclose(__stream_00);
      fclose(__stream);
      free(__s1);
      light_pcapng_release(pcapng);
    }
  }
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			FILE *tmp = fopen(TMP_FILE, "wb");
			size_t size;
			uint32_t *data = light_pcapng_to_memory(pcapng, &size);
			struct stat f_info;
			FILE *f_check = fopen(file, "rb");
			uint8_t *data_check;
			int status = 0;

			stat(file, &f_info);
			if (size != f_info.st_size) {
				fprintf(stderr, "Memory size mismatch %zu != %zu\n", size, f_info.st_size);
				goto EARLY_FAILURE;
			}
			printf("Data for %s: %zu bytes\n", file, size);

			data_check = calloc(size, 1);
			if (fread(data_check, 1, size, f_check) != size) {
				fprintf(stderr, "Error reading %s!\n", file);
				free(data_check);
				goto EARLY_FAILURE;
			}

			status = memcmp(data, data_check, size);

			if (status == 0) {
				printf("SUCCESS for %s\n\n", file);
			}
			else {
				fprintf(stderr, "FAILURE for %s\n\n", file);
			}

			fwrite(data, size, 1, tmp);

			free(data_check);
EARLY_FAILURE:
			fclose(f_check);
			fclose(tmp);
			free(data);
			light_pcapng_release(pcapng);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	// unlink(TMP_FILE);

	return EXIT_SUCCESS;
}